

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<unsigned_int,_521UL> *
trng::operator*(matrix<unsigned_int,_521UL> *a,matrix<unsigned_int,_521UL> *b)

{
  int iVar1;
  unsigned_long *puVar2;
  reference pvVar3;
  const_reference pvVar4;
  matrix<unsigned_int,_521UL> *in_RDI;
  size_type k_end;
  size_type k;
  uint sum;
  size_type j_end_1;
  size_type j_1;
  size_type i_1;
  size_type k0;
  size_type j_end;
  size_type j;
  size_type i;
  size_type j0;
  size_type step;
  matrix<unsigned_int,_521UL> *res;
  size_type in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff10;
  value_type in_stack_ffffffffffffff14;
  unsigned_long local_b0 [2];
  ulong local_a0;
  ulong local_98;
  int local_8c;
  unsigned_long local_88 [2];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  unsigned_long local_58 [2];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  undefined1 local_19;
  
  local_19 = 0;
  matrix<unsigned_int,_521UL>::matrix(in_RDI);
  local_28 = 0x20;
  for (local_30 = 0; local_30 < 0x209; local_30 = local_30 + 0x20) {
    for (local_38 = 0; local_38 < 0x209; local_38 = local_38 + 1) {
      local_40 = local_30;
      local_58[1] = 0x209;
      local_58[0] = local_30 + 0x20;
      puVar2 = utility::min<unsigned_long>(local_58 + 1,local_58);
      local_48 = *puVar2;
      for (; local_40 < local_48; local_40 = local_40 + 1) {
        pvVar3 = matrix<unsigned_int,_521UL>::operator()
                           ((matrix<unsigned_int,_521UL> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff08,0x2db70d);
        *pvVar3 = 0;
      }
    }
    for (local_60 = 0; local_60 < 0x209; local_60 = local_60 + 0x20) {
      for (local_68 = 0; local_68 < 0x209; local_68 = local_68 + 1) {
        local_70 = local_30;
        local_88[1] = 0x209;
        local_88[0] = local_30 + 0x20;
        puVar2 = utility::min<unsigned_long>(local_88 + 1,local_88);
        local_78 = *puVar2;
        for (; local_70 < local_78; local_70 = local_70 + 1) {
          local_8c = 0;
          local_98 = local_60;
          local_b0[1] = 0x209;
          local_b0[0] = local_60 + 0x20;
          puVar2 = utility::min<unsigned_long>(local_b0 + 1,local_b0);
          local_a0 = *puVar2;
          for (; iVar1 = local_8c, local_98 < local_a0; local_98 = local_98 + 1) {
            pvVar4 = matrix<unsigned_int,_521UL>::operator()
                               ((matrix<unsigned_int,_521UL> *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff08,0x2db852);
            in_stack_ffffffffffffff14 = *pvVar4;
            pvVar4 = matrix<unsigned_int,_521UL>::operator()
                               ((matrix<unsigned_int,_521UL> *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff08,0x2db87e);
            local_8c = iVar1 + in_stack_ffffffffffffff14 * *pvVar4;
          }
          pvVar3 = matrix<unsigned_int,_521UL>::operator()
                             ((matrix<unsigned_int,_521UL> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08,0x2db8e5);
          in_stack_ffffffffffffff10 = *pvVar3 + local_8c;
          pvVar3 = matrix<unsigned_int,_521UL>::operator()
                             ((matrix<unsigned_int,_521UL> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08,0x2db909);
          *pvVar3 = in_stack_ffffffffffffff10;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }